

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O3

void test_mac(ssh2_macalg *malg)

{
  undefined8 in_RAX;
  ssh2_mac *mac;
  void *vbuf;
  void *vbuf_00;
  size_t sVar1;
  ulong uVar2;
  ulong seq;
  ptrlen pVar3;
  uint8_t seqbuf [4];
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  mac = (*malg->new)(malg,(ssh_cipher *)0x0);
  if (mac != (ssh2_mac *)0x0) {
    vbuf = safemalloc((long)malg->keylen,1,0);
    vbuf_00 = safemalloc((long)malg->len + 0x100,1,0);
    sVar1 = (*looplimit)(0x10);
    if (sVar1 != 0) {
      uVar2 = 0;
      do {
        random_read(vbuf,(long)malg->keylen);
        random_read(vbuf_00,0x100);
        random_read((void *)((long)&uStack_38 + 4),4);
        seq = (ulong)(uStack_38._4_4_ >> 0x18 | (uStack_38._4_4_ & 0xff0000) >> 8 |
                      (uStack_38._4_4_ & 0xff00) << 8 | uStack_38._4_4_ << 0x18);
        test_index = test_index + 1;
        last_filename = dupprintf("%s/%s.%04zu",outdir,test_basename);
        (*log_to_file)(last_filename);
        pVar3.len = (size_t)malg->keylen;
        pVar3.ptr = vbuf;
        (*mac->vt->setkey)(mac,pVar3);
        ssh2_mac_generate(mac,vbuf_00,0x100,seq);
        ssh2_mac_verify(mac,vbuf_00,0x100,seq);
        (*log_to_file)((char *)0x0);
        safefree(last_filename);
        uVar2 = uVar2 + 1;
        sVar1 = (*looplimit)(0x10);
      } while (uVar2 < sVar1);
    }
    safefree(vbuf);
    safefree(vbuf_00);
    (*mac->vt->free)(mac);
    return;
  }
  test_skipped = 1;
  return;
}

Assistant:

static void test_mac(const ssh2_macalg *malg)
{
    ssh2_mac *m = ssh2_mac_new(malg, NULL);
    if (!m) {
        test_skipped = true;
        return;
    }

    uint8_t *mkey = snewn(malg->keylen, uint8_t);
    size_t datalen = 256;
    size_t maclen = malg->len;
    uint8_t *data = snewn(datalen + maclen, uint8_t);

    for (size_t i = 0; i < looplimit(16); i++) {
        random_read(mkey, malg->keylen);
        random_read(data, datalen);
        uint8_t seqbuf[4];
        random_read(seqbuf, 4);
        uint32_t seq = GET_32BIT_MSB_FIRST(seqbuf);

        log_start();
        ssh2_mac_setkey(m, make_ptrlen(mkey, malg->keylen));
        ssh2_mac_generate(m, data, datalen, seq);
        ssh2_mac_verify(m, data, datalen, seq);
        log_end();
    }

    sfree(mkey);
    sfree(data);
    ssh2_mac_free(m);
}